

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixellayout.cpp
# Opt level: O0

QRgbaFloat<float> *
fetchAlpha8To<QRgbaFloat<float>>
          (QRgbaFloat<float> *buffer,uchar *src,int index,int count,QList<unsigned_int> *param_5,
          QDitherInfo *param_6)

{
  long lVar1;
  QRgbaFloat<float> *pQVar2;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  QRgbaFloat<float> *in_RDI;
  long in_FS_OFFSET;
  QRgbaFloat<float> QVar3;
  int i;
  int local_44;
  undefined8 local_18;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  for (local_44 = 0; local_44 < in_ECX; local_44 = local_44 + 1) {
    QVar3 = QRgbaFloat<float>::fromRgba('\0','\0','\0',*(quint8 *)(in_RSI + (in_EDX + local_44)));
    pQVar2 = in_RDI + local_44;
    local_18 = QVar3._0_8_;
    pQVar2->r = (float)(undefined4)local_18;
    pQVar2->g = (float)local_18._4_4_;
    local_10 = QVar3._8_8_;
    pQVar2->b = (float)(undefined4)local_10;
    pQVar2->a = (float)local_10._4_4_;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static const QRgba *QT_FASTCALL fetchAlpha8To(QRgba *buffer, const uchar *src, int index, int count,
                                              const QList<QRgb> *, QDitherInfo *)
{
    for (int i = 0; i < count; ++i)
        buffer[i] = QRgba::fromRgba(0, 0, 0, src[index + i]);
    return buffer;
}